

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O3

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CheckCommitFaultInjection
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = DAT_0159ef94;
  if (DAT_0159ef94 != 0) {
    iVar2 = this->commitCount + 1;
    this->commitCount = iVar2;
    if (iVar1 == -1) {
      Output::Print(L"Commit count: %d\n");
    }
    else if (iVar2 == iVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CheckCommitFaultInjection()
{
    if (Js::Configuration::Global.flags.ForceOOMOnEBCommit == 0)
    {
        return false;
    }

    commitCount++;

    if (Js::Configuration::Global.flags.ForceOOMOnEBCommit == -1)
    {
        Output::Print(_u("Commit count: %d\n"), commitCount);
    }
    else if (commitCount == Js::Configuration::Global.flags.ForceOOMOnEBCommit)
    {
        return true;
    }

    return false;
}